

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O0

char * __thiscall glcts::TessellationShaderBarrier2::getVSCode(TessellationShaderBarrier2 *this)

{
  TessellationShaderBarrier2 *this_local;
  
  return getVSCode::vs_code;
}

Assistant:

const char* TessellationShaderBarrier2::getVSCode()
{
	static const char* vs_code = "${VERSION}\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	return vs_code;
}